

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

bool Assimp::isDataDefinitionEnd(char *tmp)

{
  bool bVar1;
  char *tmp_local;
  
  if ((*tmp == '\\') && (bVar1 = IsLineEnd<char>(tmp[1]), bVar1)) {
    tmp_local._7_1_ = true;
  }
  else {
    tmp_local._7_1_ = false;
  }
  return tmp_local._7_1_;
}

Assistant:

static bool isDataDefinitionEnd( const char *tmp ) {
    if ( *tmp == '\\' ) {
        tmp++;
        if ( IsLineEnd( *tmp ) ) {
            tmp++;
            return true;
        }
    }
    return false;
}